

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.h
# Opt level: O0

uchar * __thiscall
icu_63::LocalMemory<unsigned_char>::allocateInsteadAndCopy
          (LocalMemory<unsigned_char> *this,int32_t newCapacity,int32_t length)

{
  uchar *p;
  int32_t length_local;
  int32_t newCapacity_local;
  LocalMemory<unsigned_char> *this_local;
  
  if (newCapacity < 1) {
    this_local = (LocalMemory<unsigned_char> *)0x0;
  }
  else {
    this_local = (LocalMemory<unsigned_char> *)uprv_malloc_63((long)newCapacity);
    if (this_local != (LocalMemory<unsigned_char> *)0x0) {
      if (0 < length) {
        p._0_4_ = length;
        if (newCapacity < length) {
          p._0_4_ = newCapacity;
        }
        memcpy(this_local,(this->super_LocalPointerBase<unsigned_char>).ptr,(long)(int32_t)p);
      }
      uprv_free_63((this->super_LocalPointerBase<unsigned_char>).ptr);
      (this->super_LocalPointerBase<unsigned_char>).ptr = (uchar *)this_local;
    }
  }
  return (uchar *)this_local;
}

Assistant:

inline T *LocalMemory<T>::allocateInsteadAndCopy(int32_t newCapacity, int32_t length) {
    if(newCapacity>0) {
        T *p=(T *)uprv_malloc(newCapacity*sizeof(T));
        if(p!=NULL) {
            if(length>0) {
                if(length>newCapacity) {
                    length=newCapacity;
                }
                uprv_memcpy(p, LocalPointerBase<T>::ptr, (size_t)length*sizeof(T));
            }
            uprv_free(LocalPointerBase<T>::ptr);
            LocalPointerBase<T>::ptr=p;
        }
        return p;
    } else {
        return NULL;
    }
}